

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildTokenTestTwoCommandsInParallel::Run(BuildTokenTestTwoCommandsInParallel *this)

{
  Builder *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  string err;
  string local_70;
  string local_50;
  
  iVar3 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTokenTest).super_BuildTest.super_StateTestWithBuiltinRules.state_,
              "rule token-available\n  command = cat $in > $out\nbuild out1: token-available in1\nbuild out2: token-available in2\nbuild out12: cat out1 out2\n"
              ,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (iVar3 == g_current_test->assertion_failures_) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out12","");
    this_00 = &(this->super_BuildTokenTest).super_BuildTest.builder_;
    pNVar4 = Builder::AddTarget(this_00,&local_50,&local_70);
    testing::Test::Check
              (pTVar1,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x10b1,"builder_.AddTarget(\"out12\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pTVar1 = g_current_test;
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x10b2,"\"\" == err");
    if (bVar2) {
      BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,4,1,1,1,0);
      BuildTokenTest::ExpectAcquireToken(&this->super_BuildTokenTest,3,1,0,1);
      BuildTokenTest::ExpectWaitForCommand(&this->super_BuildTokenTest,3,1,0,0);
      pTVar1 = g_current_test;
      bVar2 = Builder::Build(this_00,&local_70);
      testing::Test::Check
                (pTVar1,!bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x10bd,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x10be,"\"stuck [this is a bug]\" == err");
      testing::Test::Check
                (g_current_test,
                 (long)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x40,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x10c0,"2u == token_command_runner_.commands_ran_.size()");
      pTVar1 = g_current_test;
      iVar3 = std::__cxx11::string::compare
                        ((char *)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      if ((iVar3 == 0) &&
         (iVar3 = std::__cxx11::string::compare
                            ((char *)((this->super_BuildTokenTest).token_command_runner_.
                                      commands_ran_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1)), iVar3 == 0))
      {
        bVar2 = true;
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar3 == 0) {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((this->super_BuildTokenTest).token_command_runner_.
                                      commands_ran_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
          bVar2 = iVar3 == 0;
        }
        else {
          bVar2 = false;
        }
      }
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x10c4,
                 "(token_command_runner_.commands_ran_[0] == \"cat in1 > out1\" && token_command_runner_.commands_ran_[1] == \"cat in2 > out2\") || (token_command_runner_.commands_ran_[0] == \"cat in2 > out2\" && token_command_runner_.commands_ran_[1] == \"cat in1 > out1\")"
                );
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(BuildTokenTest, TwoCommandsInParallel) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule token-available\n"
"  command = cat $in > $out\n"
"build out1: token-available in1\n"
"build out2: token-available in2\n"
"build out12: cat out1 out2\n"));

  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("out12", &err));
  ASSERT_EQ("", err);

  // 1st command: token available -> allow running
  // 2nd command: no token available but becomes available later
  ExpectCanRunMore(4,     true, true,  true,  false);
  ExpectAcquireToken(3,   true, false, true);
  // 1st call waits for command to finalize or token to become available
  // 2nd call waits for command to finalize
  // 3rd call waits for command to finalize
  ExpectWaitForCommand(3, true, false, false);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("stuck [this is a bug]", err);

  EXPECT_EQ(2u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > out1" &&
               token_command_runner_.commands_ran_[1] == "cat in2 > out2") ||
              (token_command_runner_.commands_ran_[0] == "cat in2 > out2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > out1"));
}